

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::lazyAssign<Eigen::Matrix<double,4,1,0,4,1>>
          (PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this,
          DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other)

{
  Matrix<double,_4,_1,_0,_4,_1> *pMVar1;
  EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_RSI;
  EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_RDI;
  
  _resize_to_match<Eigen::Matrix<double,4,1,0,4,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_RSI,in_RDI);
  EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::derived(in_RSI);
  pMVar1 = DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::lazyAssign<Eigen::Matrix<double,4,1,0,4,1>>
                     ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this,other);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }